

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O0

bool __thiscall draco::CornerTable::Reset(CornerTable *this,int num_faces,int num_vertices)

{
  uint uVar1;
  int in_EDX;
  uint in_ESI;
  ValenceCache<draco::CornerTable> *unaff_retaddr;
  uint num_faces_unsigned;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  if (((int)in_ESI < 0) || (in_EDX < 0)) {
    local_1 = false;
  }
  else {
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (uVar1 / 3 < in_ESI) {
      local_1 = false;
    }
    else {
      IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
      ::assign((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)0x1894cc);
      IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
      ::assign((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
                *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)0x1894ea);
      IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
      ::reserve((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
                 *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      ValenceCache<draco::CornerTable>::ClearValenceCache(unaff_retaddr);
      ValenceCache<draco::CornerTable>::ClearValenceCacheInaccurate(unaff_retaddr);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool CornerTable::Reset(int num_faces, int num_vertices) {
  if (num_faces < 0 || num_vertices < 0) {
    return false;
  }
  const unsigned int num_faces_unsigned = num_faces;
  if (num_faces_unsigned >
      std::numeric_limits<CornerIndex::ValueType>::max() / 3) {
    return false;
  }
  corner_to_vertex_map_.assign(num_faces_unsigned * 3, kInvalidVertexIndex);
  opposite_corners_.assign(num_faces_unsigned * 3, kInvalidCornerIndex);
  vertex_corners_.reserve(num_vertices);
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();
  return true;
}